

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

Layer * __thiscall ncnn::Net::create_overwrite_builtin_layer(Net *this,int typeindex)

{
  pointer poVar1;
  Layer *pLVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  pointer poVar6;
  
  poVar1 = (this->d->overwrite_builtin_layer_registry).
           super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar3 = -1;
  lVar4 = (long)(this->d->overwrite_builtin_layer_registry).
                super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)poVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 5;
    lVar5 = 0;
    poVar6 = poVar1;
    do {
      if (poVar6->typeindex == typeindex) {
        iVar3 = (int)lVar5;
        break;
      }
      lVar5 = lVar5 + 1;
      poVar6 = poVar6 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  if (iVar3 != -1) {
    if (poVar1[iVar3].creator != (layer_creator_func)0x0) {
      pLVar2 = (*poVar1[iVar3].creator)(poVar1[iVar3].userdata);
      pLVar2->typeindex = typeindex;
      return pLVar2;
    }
  }
  return (Layer *)0x0;
}

Assistant:

Layer* Net::create_overwrite_builtin_layer(int typeindex)
{
    int index = -1;
    const size_t overwrite_builtin_layer_registry_entry_count = d->overwrite_builtin_layer_registry.size();
    for (size_t i = 0; i < overwrite_builtin_layer_registry_entry_count; i++)
    {
        if (d->overwrite_builtin_layer_registry[i].typeindex == typeindex)
        {
            index = i;
            break;
        }
    }

    if (index == -1)
        return 0;

    layer_creator_func layer_creator = d->overwrite_builtin_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator(d->overwrite_builtin_layer_registry[index].userdata);
    layer->typeindex = typeindex;
    return layer;
}